

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O0

float __thiscall ImpactGenerator::Impact::Process(Impact *this,Random *random)

{
  float fVar1;
  float fVar2;
  Random *random_local;
  Impact *this_local;
  
  this->volume = this->decay * this->volume;
  this->lpf = this->cut * this->bpf + this->lpf;
  fVar1 = this->cut;
  fVar2 = Random::GetFloat(random,-1.0,1.0);
  this->bpf = fVar1 * (-this->bpf * this->bw + (fVar2 - this->lpf)) + this->bpf;
  return this->bpf * this->volume;
}

Assistant:

inline float Process(Random& random)
        {
            volume *= decay;
            lpf += cut * bpf;
            bpf += cut * (random.GetFloat(-1.0f, 1.0f) - lpf - bpf * bw);
            return bpf * volume;
        }